

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolormap.cpp
# Opt level: O1

QColor __thiscall QColormap::colorAt(QColormap *this,uint pixel)

{
  QColor QVar1;
  ulong uVar2;
  long in_FS_OFFSET;
  undefined4 local_18;
  ushort uStack_12;
  ushort uStack_10;
  ushort uStack_e;
  undefined2 uStack_a;
  
  uVar2 = (ulong)pixel;
  if (this->d->mode == Direct) {
    if (this->d->depth == 0x10) {
      uVar2 = (ulong)((pixel >> 2 & 7) + (pixel & 0x1f) * 8 |
                     ((pixel & 0x7e0) >> 9 | (pixel & 0x7e0) >> 3) << 8 |
                     ((uint)(((ulong)pixel & 0xffff) >> 0xd) | pixel >> 8 & 0xf8) << 0x10);
    }
    local_18 = 1;
    uStack_12 = (ushort)((int)(uVar2 >> 0x10) << 8) | (ushort)(uVar2 >> 0x10) & 0xff;
    uStack_10 = (ushort)uVar2 & 0xff00 | (ushort)(uVar2 >> 8) & 0xff;
    uStack_e = (ushort)((int)uVar2 << 8) | (ushort)uVar2 & 0xff;
  }
  else {
    local_18 = 0;
    uStack_12 = 0;
    uStack_10 = 0;
    uStack_e = 0;
  }
  QVar1.ct.argb.alpha = 0xffff;
  QVar1.cspec = local_18;
  QVar1.ct.argb.red = uStack_12;
  QVar1.ct.argb.green = uStack_10;
  QVar1.ct.argb.blue = uStack_e;
  QVar1.ct.argb.pad = 0;
  QVar1._14_2_ = uStack_a;
  if (*(long *)(in_FS_OFFSET + 0x28) == *(long *)(in_FS_OFFSET + 0x28)) {
    return QVar1;
  }
  __stack_chk_fail();
}

Assistant:

const QColor QColormap::colorAt(uint pixel) const
{
    if (d->mode == Direct) {
        if (d->depth == 16) {
            pixel = qt_conv16ToRgb(pixel);
        }
        const int red_shift = 16;
        const int green_shift = 8;
        const int red_mask   = 0xff0000;
        const int green_mask = 0x00ff00;
        const int blue_mask  = 0x0000ff;
        return QColor((pixel & red_mask) >> red_shift,
                      (pixel & green_mask) >> green_shift,
                      (pixel & blue_mask));
    }
#if 0 // XXX
    Q_ASSERT_X(int(pixel) < qt_screen->numCols(), "QColormap::colorAt", "pixel out of bounds of palette");
    return QColor(qt_screen->clut()[pixel]);
#endif
    return QColor();
}